

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t tohex(wchar_t c)

{
  undefined4 local_c;
  wchar_t c_local;
  
  if ((c < L'0') || (L'9' < c)) {
    if ((c < L'A') || (L'F' < c)) {
      if ((c < L'a') || (L'f' < c)) {
        local_c = L'\xffffffff';
      }
      else {
        local_c = c + L'\xffffffa9';
      }
    }
    else {
      local_c = c + L'\xffffffc9';
    }
  }
  else {
    local_c = c + L'\xffffffd0';
  }
  return local_c;
}

Assistant:

static int
tohex(int c)
{
	if (c >= '0' && c <= '9')
		return (c - '0');
	else if (c >= 'A' && c <= 'F')
		return (c - 'A' + 10);
	else if (c >= 'a' && c <= 'f')
		return (c - 'a' + 10);
	else
		return (-1);
}